

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::TransSetSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,TransSetSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  SyntaxNode *local_60;
  size_t index_local;
  TransSetSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->openParen).kind;
    token._2_1_ = (this->openParen).field_0x2;
    token.numFlags.raw = (this->openParen).numFlags.raw;
    token.rawLen = (this->openParen).rawLen;
    token.info = (this->openParen).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    local_60 = (SyntaxNode *)0x0;
    if (this != (TransSetSyntax *)0xffffffffffffffe0) {
      local_60 = &(this->ranges).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_60);
  }
  else if (index == 2) {
    token_00.kind = (this->closeParen).kind;
    token_00._2_1_ = (this->closeParen).field_0x2;
    token_00.numFlags.raw = (this->closeParen).numFlags.raw;
    token_00.rawLen = (this->closeParen).rawLen;
    token_00.info = (this->closeParen).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax TransSetSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return openParen;
        case 1: return &ranges;
        case 2: return closeParen;
        default: return nullptr;
    }
}